

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::Reserve(RepeatedPtrFieldBase *this,int new_size)

{
  void **__src;
  uint uVar1;
  void **__dest;
  ulong uVar2;
  
  if (this->total_size_ < new_size) {
    __src = this->elements_;
    uVar1 = this->total_size_ * 2;
    if ((int)uVar1 <= new_size) {
      uVar1 = new_size;
    }
    uVar2 = 4;
    if (4 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    this->total_size_ = (int)uVar2;
    __dest = (void **)operator_new__(uVar2 << 3);
    this->elements_ = __dest;
    if (__src != (void **)0x0) {
      memcpy(__dest,__src,(long)this->allocated_size_ << 3);
      operator_delete__(__src);
      return;
    }
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Reserve(int new_size) {
  if (total_size_ >= new_size) return;

  void** old_elements = elements_;
  total_size_ = max(kMinRepeatedFieldAllocationSize,
                    max(total_size_ * 2, new_size));
  elements_ = new void*[total_size_];
  if (old_elements != NULL) {
    memcpy(elements_, old_elements, allocated_size_ * sizeof(elements_[0]));
    delete [] old_elements;
  }
}